

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrModeImm12Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  cs_struct *h;
  _Bool _Var1;
  uint uVar2;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar3;
  bool bVar4;
  uint local_3c;
  _Bool isSub;
  int32_t OffImm;
  MCOperand *MO2;
  MCOperand *MO1;
  _Bool AlwaysPrintImm0_local;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  _Var1 = MCOperand_isReg(op);
  if (_Var1) {
    SStream_concat0(O,"[");
    set_mem_access(MI,true);
    h = MI->csh;
    uVar2 = MCOperand_getReg(op);
    printRegName(h,O,uVar2);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar2 = MCOperand_getReg(op);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar2;
    }
    iVar3 = MCOperand_getImm(op_00);
    local_3c = (uint)iVar3;
    bVar4 = (int)local_3c < 0;
    if (local_3c == 0x80000000) {
      local_3c = 0;
    }
    if (bVar4) {
      if ((int)local_3c < -9) {
        SStream_concat(O,", #-0x%x",(ulong)-local_3c);
      }
      else {
        SStream_concat(O,", #-%u",(ulong)-local_3c);
      }
    }
    else if ((AlwaysPrintImm0) || (0 < (int)local_3c)) {
      if ((int)local_3c < 0) {
        if ((int)local_3c < -9) {
          SStream_concat(O,", #-0x%x",(ulong)-local_3c);
        }
        else {
          SStream_concat(O,", #-%u",(ulong)-local_3c);
        }
      }
      else if ((int)local_3c < 10) {
        SStream_concat(O,", #%u",(ulong)local_3c);
      }
      else {
        SStream_concat(O,", #0x%x",(ulong)local_3c);
      }
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = local_3c;
    }
    SStream_concat0(O,"]");
    set_mem_access(MI,false);
  }
  else {
    printOperand(MI,OpNum,O);
  }
  return;
}

Assistant:

static void printAddrModeImm12Operand(MCInst *MI, unsigned OpNum,
		SStream *O, bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, OpNum, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));

	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;
	// Special value for #-0. All others are normal.
	if (OffImm == INT32_MIN)
		OffImm = 0;
	if (isSub) {
		if (OffImm < -HEX_THRESHOLD)
			SStream_concat(O, ", #-0x%x", -OffImm);
		else
			SStream_concat(O, ", #-%u", -OffImm);
	} else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm >= 0) {
			if (OffImm > HEX_THRESHOLD)
				SStream_concat(O, ", #0x%x", OffImm);
			else
				SStream_concat(O, ", #%u", OffImm);
		} else {
			if (OffImm < -HEX_THRESHOLD)
				SStream_concat(O, ", #-0x%x", -OffImm);
			else
				SStream_concat(O, ", #-%u", -OffImm);
		}
	}
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}